

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::HlslParseContext::splitBuiltIn
          (HlslParseContext *this,TString *baseName,TType *memberType,TArraySizes *arraySizes,
          TQualifier *outerQualifier)

{
  pointer pcVar1;
  size_type *psVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  iterator iVar4;
  undefined4 extraout_var_01;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar5;
  TVariable *pTVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  mapped_type *ppTVar7;
  undefined4 extraout_var_04;
  long lVar8;
  undefined4 extraout_var_05;
  TQualifier *dst;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
  *paVar9;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> __str;
  key_type local_80;
  size_type *local_78;
  size_type local_70;
  size_type local_68;
  undefined8 uStack_60;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  
  iVar3 = (*memberType->_vptr_TType[0xb])(memberType);
  if (1 < (*(uint *)(CONCAT44(extraout_var,iVar3) + 8) >> 7 & 0x1ff) - 0x21) {
    iVar3 = (*memberType->_vptr_TType[0xb])(memberType);
    local_80 = (key_type)
               (CONCAT44(*(undefined4 *)&outerQualifier->field_0x8,
                         *(uint *)(CONCAT44(extraout_var_00,iVar3) + 8) >> 7) & 0x7f000001ff);
    iVar4 = std::
            _Rb_tree<glslang::HlslParseContext::tInterstageIoData,_std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>,_std::_Select1st<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>,_std::less<glslang::HlslParseContext::tInterstageIoData>,_glslang::pool_allocator<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>_>
            ::find((_Rb_tree<glslang::HlslParseContext::tInterstageIoData,_std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>,_std::_Select1st<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>,_std::less<glslang::HlslParseContext::tInterstageIoData>,_glslang::pool_allocator<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>_>
                    *)&this->splitBuiltIns,&local_80);
    if ((_Rb_tree_header *)iVar4._M_node !=
        &(this->splitBuiltIns).
         super_map<glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*,_std::less<glslang::HlslParseContext::tInterstageIoData>,_glslang::pool_allocator<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>_>
         ._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
  }
  local_58._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  pcVar1 = (baseName->_M_dataplus)._M_p;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                      &local_58,pcVar1,pcVar1 + baseName->_M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (&local_58,".");
  iVar3 = (*memberType->_vptr_TType[6])(memberType);
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
           ::_M_append(&local_58,*(char **)(CONCAT44(extraout_var_01,iVar3) + 8),
                       *(size_type *)(CONCAT44(extraout_var_01,iVar3) + 0x10));
  local_78 = &local_68;
  local_80 = (key_type)(pbVar5->_M_dataplus).super_allocator_type.allocator;
  psVar2 = (size_type *)(pbVar5->_M_dataplus)._M_p;
  paVar9 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
       *)psVar2 == paVar9) {
    local_68 = paVar9->_M_allocated_capacity;
    uStack_60 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_68 = paVar9->_M_allocated_capacity;
    local_78 = psVar2;
  }
  local_70 = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  pTVar6 = makeInternalVariable(this,(char *)local_78,memberType);
  if ((arraySizes != (TArraySizes *)0x0) &&
     (iVar3 = (*memberType->_vptr_TType[0x1d])(memberType), (char)iVar3 == '\0')) {
    iVar3 = (*(pTVar6->super_TSymbol)._vptr_TSymbol[0xd])(pTVar6);
    TType::copyArraySizes((TType *)CONCAT44(extraout_var_02,iVar3),arraySizes);
  }
  iVar3 = (*memberType->_vptr_TType[0xb])(memberType);
  local_80 = (key_type)
             (CONCAT44(*(undefined4 *)&outerQualifier->field_0x8,
                       *(uint *)(CONCAT44(extraout_var_03,iVar3) + 8) >> 7) & 0x7f000001ff);
  ppTVar7 = std::
            map<glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*,_std::less<glslang::HlslParseContext::tInterstageIoData>,_glslang::pool_allocator<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>_>
            ::operator[](&(this->splitBuiltIns).
                          super_map<glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*,_std::less<glslang::HlslParseContext::tInterstageIoData>,_glslang::pool_allocator<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>_>
                         ,&local_80);
  *ppTVar7 = pTVar6;
  iVar3 = (*(pTVar6->super_TSymbol)._vptr_TSymbol[0xc])(pTVar6);
  lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0x58))
                    ((long *)CONCAT44(extraout_var_04,iVar3));
  if (1 < (*(uint *)(lVar8 + 8) >> 7 & 0x1ff) - 0x21) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])(this,pTVar6);
  }
  iVar3 = (*(pTVar6->super_TSymbol)._vptr_TSymbol[0xd])(pTVar6);
  dst = (TQualifier *)
        (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar3) + 0x50))
                  ((long *)CONCAT44(extraout_var_05,iVar3));
  mergeQualifiers(this,dst,outerQualifier);
  iVar3 = (*(pTVar6->super_TSymbol)._vptr_TSymbol[0xd])(pTVar6);
  fixBuiltInIoType(this,(TType *)CONCAT44(extraout_var_06,iVar3));
  iVar3 = (*(pTVar6->super_TSymbol)._vptr_TSymbol[0xd])(pTVar6);
  lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar3) + 0x50))
                    ((long *)CONCAT44(extraout_var_07,iVar3));
  *(ushort *)(lVar8 + 0x1c) = *(ushort *)(lVar8 + 0x1c) | 0xfff;
  return;
}

Assistant:

void HlslParseContext::splitBuiltIn(const TString& baseName, const TType& memberType, const TArraySizes* arraySizes,
                                    const TQualifier& outerQualifier)
{
    // Because of arrays of structs, we might be asked more than once,
    // but the arraySizes passed in should have captured the whole thing
    // the first time.
    // However, clip/cull rely on multiple updates.
    if (!isClipOrCullDistance(memberType))
        if (splitBuiltIns.find(tInterstageIoData(memberType.getQualifier().builtIn, outerQualifier.storage)) !=
            splitBuiltIns.end())
            return;

    TVariable* ioVar = makeInternalVariable(baseName + "." + memberType.getFieldName(), memberType);

    if (arraySizes != nullptr && !memberType.isArray())
        ioVar->getWritableType().copyArraySizes(*arraySizes);

    splitBuiltIns[tInterstageIoData(memberType.getQualifier().builtIn, outerQualifier.storage)] = ioVar;
    if (!isClipOrCullDistance(ioVar->getType()))
        trackLinkage(*ioVar);

    // Merge qualifier from the user structure
    mergeQualifiers(ioVar->getWritableType().getQualifier(), outerQualifier);

    // Fix the builtin type if needed (e.g, some types require fixed array sizes, no matter how the
    // shader declared them).  This is done after mergeQualifiers(), in case fixBuiltInIoType looks
    // at the qualifier to determine e.g, in or out qualifications.
    fixBuiltInIoType(ioVar->getWritableType());

    // But, not location, we're losing that
    ioVar->getWritableType().getQualifier().layoutLocation = TQualifier::layoutLocationEnd;
}